

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O2

void __thiscall
eglu::GLContextFactory::GLContextFactory
          (GLContextFactory *this,NativeDisplayFactoryRegistry *displayFactoryRegistry)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"egl",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"EGL OpenGL Context",&local_52);
  glu::ContextFactory::ContextFactory(&this->super_ContextFactory,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_ContextFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__ContextFactory_003df360;
  this->m_displayFactoryRegistry = displayFactoryRegistry;
  return;
}

Assistant:

GLContextFactory::GLContextFactory (const NativeDisplayFactoryRegistry& displayFactoryRegistry)
	: glu::ContextFactory		("egl", "EGL OpenGL Context")
	, m_displayFactoryRegistry	(displayFactoryRegistry)
{
}